

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::
SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
::reallocateTo(SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
               *this,size_type newCapacity)

{
  pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef> *__last;
  iterator ctx;
  pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef> *in_RSI;
  SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
  *in_RDI;
  pointer newData;
  
  __last = (pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef> *)
           operator_new(0x81d576);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::
  uninitialized_move<std::pair<slang::IntervalMapDetails::NodeRef,slang::IntervalMapDetails::NodeRef>*,std::pair<slang::IntervalMapDetails::NodeRef,slang::IntervalMapDetails::NodeRef>*>
            (in_RSI,__last,
             (pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef> *)in_RDI)
  ;
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }